

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

IVec2 __thiscall
deqp::egl::checkSurfaceSize
          (egl *this,Library *egl,EGLDisplay eglDisplay,EGLSurface eglSurface,
          NativeWindow *nativeWindow,IVec2 *reqSize,ResultCollector *status)

{
  bool condition;
  ostream *poVar1;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream oss;
  Vector<int,_2> local_40;
  IVec2 nativeSize;
  IVec2 *reqSize_local;
  NativeWindow *nativeWindow_local;
  EGLSurface eglSurface_local;
  EGLDisplay eglDisplay_local;
  Library *egl_local;
  IVec2 *eglSize;
  
  nativeSize.m_data = (int  [2])reqSize;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&oss.field_0x170,reqSize);
  getNativeSurfaceSize((egl *)&local_40,nativeWindow,(IVec2 *)&oss.field_0x170);
  eglu::getSurfaceSize((eglu *)this,egl,eglDisplay,eglSurface);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  poVar1 = std::operator<<((ostream *)local_1c0,"Size of EGL surface ");
  poVar1 = tcu::operator<<(poVar1,(Vector<int,_2> *)this);
  poVar1 = std::operator<<(poVar1," differs from size of native window ");
  tcu::operator<<(poVar1,&local_40);
  condition = tcu::Vector<int,_2>::operator==((Vector<int,_2> *)this,&local_40);
  std::__cxx11::ostringstream::str();
  tcu::ResultCollector::check(status,condition,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 checkSurfaceSize (const Library&		egl,
						EGLDisplay			eglDisplay,
						EGLSurface			eglSurface,
						const NativeWindow&	nativeWindow,
						IVec2				reqSize,
						ResultCollector&	status)
{
	const IVec2		nativeSize	= getNativeSurfaceSize(nativeWindow, reqSize);
	IVec2			eglSize		= eglu::getSurfaceSize(egl, eglDisplay, eglSurface);
	ostringstream	oss;

	oss << "Size of EGL surface " << eglSize
		<< " differs from size of native window " << nativeSize;
	status.check(eglSize == nativeSize, oss.str());

	return eglSize;
}